

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_16x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 (*in_RCX) [16];
  long in_RSI;
  undefined8 *in_RDI;
  __m128i *extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  __m128i *extraout_XMM0_Qb;
  __m128i *extraout_XMM0_Qb_00;
  __m128i row_1;
  __m128i row;
  int i;
  __m128i l16;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i top1;
  __m128i top0;
  __m128i zero;
  __m128i t;
  __m128i l;
  __m128i *in_stack_fffffffffffffd60;
  __m128i *in_stack_fffffffffffffd68;
  __m128i *in_stack_fffffffffffffd70;
  __m128i *in_stack_fffffffffffffd78;
  int local_27c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_1d0;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  
  auVar3 = *in_RCX;
  local_258 = 0x8000800080008000;
  uStack_250 = 0x8000800080008000;
  local_1d0 = in_RDI;
  for (local_27c = 0; local_27c < 0x10; local_27c = local_27c + 1) {
    auVar2._8_8_ = uStack_250;
    auVar2._0_8_ = local_258;
    pshufb(auVar3,auVar2);
    paeth_16x1_pred(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                    in_stack_fffffffffffffd60);
    *local_1d0 = extraout_XMM0_Qa;
    local_1d0[1] = extraout_XMM0_Qb;
    local_1d0 = (undefined8 *)(in_RSI + (long)local_1d0);
    local_118 = (short)local_258;
    sStack_116 = (short)((ulong)local_258 >> 0x10);
    sStack_114 = (short)((ulong)local_258 >> 0x20);
    sStack_112 = (short)((ulong)local_258 >> 0x30);
    sStack_110 = (short)uStack_250;
    sStack_10e = (short)((ulong)uStack_250 >> 0x10);
    sStack_10c = (short)((ulong)uStack_250 >> 0x20);
    sStack_10a = (short)((ulong)uStack_250 >> 0x30);
    local_258._0_4_ = CONCAT22(sStack_116 + 1,local_118 + 1);
    local_258._0_6_ = CONCAT24(sStack_114 + 1,(undefined4)local_258);
    local_258 = CONCAT26(sStack_112 + 1,(undefined6)local_258);
    uStack_250._0_4_ = CONCAT22(sStack_10e + 1,sStack_110 + 1);
    uStack_250._0_6_ = CONCAT24(sStack_10c + 1,(undefined4)uStack_250);
    uStack_250 = CONCAT26(sStack_10a + 1,(undefined6)uStack_250);
    in_stack_fffffffffffffd68 = extraout_XMM0_Qa;
    in_stack_fffffffffffffd70 = extraout_XMM0_Qb;
  }
  auVar3 = in_RCX[1];
  local_258 = 0x8000800080008000;
  uStack_250 = 0x8000800080008000;
  for (local_27c = 0; local_27c < 0x10; local_27c = local_27c + 1) {
    auVar1._8_8_ = uStack_250;
    auVar1._0_8_ = local_258;
    pshufb(auVar3,auVar1);
    paeth_16x1_pred(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                    in_stack_fffffffffffffd60);
    *local_1d0 = extraout_XMM0_Qa_00;
    local_1d0[1] = extraout_XMM0_Qb_00;
    local_1d0 = (undefined8 *)(in_RSI + (long)local_1d0);
    local_138 = (short)local_258;
    sStack_136 = (short)((ulong)local_258 >> 0x10);
    sStack_134 = (short)((ulong)local_258 >> 0x20);
    sStack_132 = (short)((ulong)local_258 >> 0x30);
    sStack_130 = (short)uStack_250;
    sStack_12e = (short)((ulong)uStack_250 >> 0x10);
    sStack_12c = (short)((ulong)uStack_250 >> 0x20);
    sStack_12a = (short)((ulong)uStack_250 >> 0x30);
    local_258._0_4_ = CONCAT22(sStack_136 + 1,local_138 + 1);
    local_258._0_6_ = CONCAT24(sStack_134 + 1,(undefined4)local_258);
    local_258 = CONCAT26(sStack_132 + 1,(undefined6)local_258);
    uStack_250._0_4_ = CONCAT22(sStack_12e + 1,sStack_130 + 1);
    uStack_250._0_6_ = CONCAT24(sStack_12c + 1,(undefined4)uStack_250);
    uStack_250 = CONCAT26(sStack_12a + 1,(undefined6)uStack_250);
    in_stack_fffffffffffffd60 = extraout_XMM0_Qb_00;
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i l = _mm_load_si128((const __m128i *)left);
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }

  l = _mm_load_si128((const __m128i *)(left + 16));
  rep = _mm_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}